

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhash.cpp
# Opt level: O1

void __thiscall
CVmHashTable::enum_entries(CVmHashTable *this,_func_void_void_ptr_CVmHashEntry_ptr *func,void *ctx)

{
  CVmHashEntry *pCVar1;
  CVmHashEntry *pCVar2;
  CVmHashEntry **ppCVar3;
  ulong uVar4;
  
  if (this->table_size_ != 0) {
    ppCVar3 = this->table_;
    uVar4 = 0;
    do {
      pCVar2 = *ppCVar3;
      while (pCVar2 != (CVmHashEntry *)0x0) {
        pCVar1 = pCVar2->nxt_;
        (*func)(ctx,pCVar2);
        pCVar2 = pCVar1;
      }
      uVar4 = uVar4 + 1;
      ppCVar3 = ppCVar3 + 1;
    } while (uVar4 < this->table_size_);
  }
  return;
}

Assistant:

void CVmHashTable::enum_entries(void (*func)(void *, CVmHashEntry *),
                                void *ctx)
{
    CVmHashEntry **tableptr;
    size_t i;

    /* go through each hash value */
    for (tableptr = table_, i = 0 ; i < table_size_ ; ++i, ++tableptr)
    {
        CVmHashEntry *entry;
        CVmHashEntry *nxt;

        /* go through each entry at this hash value */
        for (entry = *tableptr ; entry ; entry = nxt)
        {
            /* 
             *   remember the next entry, in case the callback deletes the
             *   current entry 
             */
            nxt = entry->nxt_;

            /* invoke the callback on this entry */
            (*func)(ctx, entry);
        }
    }
}